

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O3

ze_result_t driver::zetMetricTracerDestroyExp(zet_metric_tracer_exp_handle_t hMetricTracer)

{
  ze_result_t zVar1;
  
  if (DAT_0010e758 != (code *)0x0) {
    zVar1 = (*DAT_0010e758)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricTracerDestroyExp(
        zet_metric_tracer_exp_handle_t hMetricTracer    ///< [in] handle of the metric tracer
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnDestroyExp = context.zetDdiTable.MetricTracerExp.pfnDestroyExp;
        if( nullptr != pfnDestroyExp )
        {
            result = pfnDestroyExp( hMetricTracer );
        }
        else
        {
            // generic implementation
        }

        return result;
    }